

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

fio_str_info_s *
fio_str_capa_assert(fio_str_info_s *__return_storage_ptr__,fio_str_s_conflict *s,size_t needed)

{
  size_t __dest;
  int *piVar1;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 auStack_56 [14];
  char *local_48;
  size_t local_40;
  code *local_38;
  size_t local_30;
  size_t local_28;
  size_t existing_len;
  char *tmp;
  size_t needed_local;
  fio_str_s_conflict *s_local;
  
  needed_local = (size_t)s;
  if ((s == (fio_str_s_conflict *)0x0) || (s->frozen != '\0')) {
    tmp = (char *)needed;
    fio_str_info(__return_storage_ptr__,s);
  }
  else if ((s->small == '\0') && (s->data != (char *)0x0)) {
    if (needed < s->capa) {
      __return_storage_ptr__->capa = s->capa;
      __return_storage_ptr__->len = s->len;
      __return_storage_ptr__->data = s->data;
    }
    else {
      tmp = (char *)(needed + 1 | 0xf);
      if (s->dealloc == fio_free) {
        existing_len = (size_t)fio_realloc2(s->data,(size_t)(tmp + 1),s->len + 1);
        if ((void *)existing_len == (void *)0x0) {
          if (0 < FIO_LOG_LEVEL) {
            FIO_LOG2STDERR(
                          "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.h:4024"
                          );
          }
          kill(0,2);
          piVar1 = __errno_location();
          exit(*piVar1);
        }
      }
      else {
        existing_len = (size_t)fio_malloc((size_t)(tmp + 1));
        if ((void *)existing_len == (void *)0x0) {
          if (0 < FIO_LOG_LEVEL) {
            FIO_LOG2STDERR(
                          "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.h:4027"
                          );
          }
          kill(0,2);
          piVar1 = __errno_location();
          exit(*piVar1);
        }
        memcpy((void *)existing_len,*(void **)(needed_local + 0x28),
               *(long *)(needed_local + 0x18) + 1);
        if (*(long *)(needed_local + 0x20) != 0) {
          (**(code **)(needed_local + 0x20))(*(undefined8 *)(needed_local + 0x28));
        }
        *(code **)(needed_local + 0x20) = fio_free;
      }
      *(char **)(needed_local + 0x10) = tmp;
      *(size_t *)(needed_local + 0x28) = existing_len;
      tmp[*(long *)(needed_local + 0x28)] = '\0';
      __return_storage_ptr__->capa = *(size_t *)(needed_local + 0x10);
      __return_storage_ptr__->len = *(size_t *)(needed_local + 0x18);
      __return_storage_ptr__->data = *(char **)(needed_local + 0x28);
    }
  }
  else if (needed < 0x2e) {
    __return_storage_ptr__->capa = 0x2d;
    __return_storage_ptr__->len = (long)((int)(uint)s->small >> 1);
    __return_storage_ptr__->data = (char *)s->reserved;
  }
  else {
    tmp = (char *)(needed + 1 | 0xf);
    existing_len = (size_t)fio_malloc((size_t)(tmp + 1));
    if ((undefined1 *)existing_len == (undefined1 *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.h:4042"
                      );
      }
      kill(0,2);
      piVar1 = __errno_location();
      exit(*piVar1);
    }
    local_28 = (size_t)((int)(uint)*(byte *)needed_local >> 1);
    if (local_28 == 0) {
      *(undefined1 *)existing_len = 0;
    }
    else {
      memcpy((void *)existing_len,(void *)(needed_local + 2),local_28 + 1);
    }
    __dest = needed_local;
    local_58 = 0;
    local_57 = 0;
    memset(auStack_56,0,0xe);
    local_48 = tmp;
    local_40 = local_28;
    local_38 = fio_free;
    local_30 = existing_len;
    memcpy((void *)__dest,&local_58,0x30);
    __return_storage_ptr__->capa = (size_t)tmp;
    __return_storage_ptr__->len = local_28;
    __return_storage_ptr__->data = *(char **)(needed_local + 0x28);
  }
  return __return_storage_ptr__;
}

Assistant:

FIO_FUNC fio_str_info_s fio_str_capa_assert(fio_str_s *s, size_t needed) {
  if (!s || s->frozen) {
    return fio_str_info(s);
  }
  char *tmp;
  if (s->small || !s->data) {
    if (needed < FIO_STR_SMALL_CAPA) {
      return (fio_str_info_s){.capa = (FIO_STR_SMALL_CAPA - 1),
                              .len = (size_t)(s->small >> 1),
                              .data = FIO_STR_SMALL_DATA(s)};
    }
    goto is_small;
  }
  if (needed < s->capa) {
    return (fio_str_info_s){.capa = s->capa, .len = s->len, .data = s->data};
  }
  needed = ROUND_UP_CAPA2WORDS(needed);
  if (s->dealloc == FIO_FREE) {
    tmp = (char *)FIO_REALLOC(s->data, needed + 1, s->len + 1);
    FIO_ASSERT_ALLOC(tmp);
  } else {
    tmp = (char *)FIO_MALLOC(needed + 1);
    FIO_ASSERT_ALLOC(tmp);
    memcpy(tmp, s->data, s->len + 1);
    if (s->dealloc)
      s->dealloc(s->data);
    s->dealloc = FIO_FREE;
  }
  s->capa = needed;
  s->data = tmp;
  s->data[needed] = 0;
  return (fio_str_info_s){.capa = s->capa, .len = s->len, .data = s->data};

is_small:
  /* small string (string data is within the container) */
  needed = ROUND_UP_CAPA2WORDS(needed);
  tmp = (char *)FIO_MALLOC(needed + 1);
  FIO_ASSERT_ALLOC(tmp);
  const size_t existing_len = (size_t)((s->small >> 1) & 0xFF);
  if (existing_len) {
    memcpy(tmp, FIO_STR_SMALL_DATA(s), existing_len + 1);
  } else {
    tmp[0] = 0;
  }
#ifdef FIO_STR_NO_REF
  *s = (fio_str_s){
      .small = 0,
      .capa = needed,
      .len = existing_len,
      .dealloc = FIO_FREE,
      .data = tmp,
  };
#else
  *s = (fio_str_s){
      .ref = s->ref,
      .small = 0,
      .capa = needed,
      .len = existing_len,
      .dealloc = FIO_FREE,
      .data = tmp,
  };
#endif
  return (fio_str_info_s){.capa = needed, .len = existing_len, .data = s->data};
}